

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QRectF * __thiscall QWidgetTextControl::selectionRect(QWidgetTextControl *this,QTextCursor *cursor)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  long *plVar8;
  undefined8 uVar9;
  QTextEngine *extraout_RDX;
  QTextEngine *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar10;
  int i;
  QTextLayout *layout;
  int lastLine;
  int firstLine;
  int anchor;
  int position;
  QTextTable *table;
  QWidgetTextControlPrivate *d;
  QRectF frameRect;
  QRectF anchorRect;
  QTextLine anchorLine;
  QTextLine posLine;
  QTextBlock anchorBlock;
  QTextBlock posBlock;
  QPointF *in_stack_fffffffffffffde8;
  QRectF *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int local_1c4;
  QTextCursor *in_stack_fffffffffffffe40;
  QWidgetTextControlPrivate *in_stack_fffffffffffffe78;
  undefined1 local_128 [32];
  QPointF local_108;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_c8;
  undefined8 local_c0;
  QRectF local_98;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  QTextEngine *local_60;
  undefined1 *local_58;
  QTextEngine *local_50;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar8 = in_RSI;
  d_func((QWidgetTextControl *)0x711ce8);
  iVar4 = (int)((ulong)plVar8 >> 0x20);
  in_RDI->xp = -NAN;
  in_RDI->yp = -NAN;
  in_RDI->w = -NAN;
  in_RDI->h = -NAN;
  QTextCursor::selectionStart();
  QWidgetTextControlPrivate::rectForPosition(in_stack_fffffffffffffe78,iVar4);
  uVar5 = QTextCursor::hasComplexSelection();
  if (((uVar5 & 1) != 0) && (lVar6 = QTextCursor::currentTable(), lVar6 != 0)) {
    uVar9 = QTextCursor::currentTable();
    plVar8 = (long *)QTextDocument::documentLayout();
    (**(code **)(*plVar8 + 0x80))(&local_48,plVar8,uVar9);
    in_RDI->xp = local_48;
    in_RDI->yp = local_40;
    in_RDI->w = local_38;
    in_RDI->h = local_30;
    goto LAB_007122f2;
  }
  uVar5 = QTextCursor::hasSelection();
  if ((uVar5 & 1) == 0) goto LAB_007122f2;
  uVar2 = QTextCursor::selectionStart();
  QTextCursor::selectionEnd();
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlock((int)local_18);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlock((int)local_28);
  bVar1 = QTextBlock::operator==((QTextBlock *)local_18,(QTextBlock *)local_28);
  if ((bVar1) && (uVar5 = QTextBlock::isValid(), (uVar5 & 1) != 0)) {
    QTextBlock::layout();
    iVar3 = QTextLayout::lineCount();
    if (iVar3 == 0) goto LAB_0071217d;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    iVar4 = QTextBlock::layout();
    QTextBlock::position();
    iVar4 = QTextLayout::lineForTextPosition(iVar4);
    local_58 = (undefined1 *)CONCAT44(local_58._4_4_,iVar4);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = extraout_RDX;
    iVar4 = QTextBlock::layout();
    QTextBlock::position();
    iVar4 = QTextLayout::lineForTextPosition(iVar4);
    local_68 = (undefined1 *)CONCAT44(local_68._4_4_,iVar4);
    local_60 = extraout_RDX_00;
    local_6c = QTextLine::lineNumber((QTextLine *)&local_58);
    local_70 = QTextLine::lineNumber((QTextLine *)&local_68);
    piVar7 = qMin<int>(&local_6c,&local_70);
    local_1c4 = *piVar7;
    local_74 = QTextLine::lineNumber((QTextLine *)&local_58);
    local_78 = QTextLine::lineNumber((QTextLine *)&local_68);
    piVar7 = qMax<int>(&local_74,&local_78);
    iVar4 = *piVar7;
    uVar9 = QTextBlock::layout();
    QRectF::QRectF(&local_98);
    in_RDI->xp = local_98.xp;
    in_RDI->yp = local_98.yp;
    in_RDI->w = local_98.w;
    in_RDI->h = local_98.h;
    for (; local_1c4 <= iVar4; local_1c4 = local_1c4 + 1) {
      local_c8 = QTextLayout::lineAt((int)uVar9);
      local_c0 = extraout_RDX_01;
      QTextLine::rect();
      QRectF::operator|=((QRectF *)CONCAT44(uVar2,in_stack_fffffffffffffdf8),
                         in_stack_fffffffffffffdf0);
      local_f8 = QTextLayout::lineAt((int)uVar9);
      local_f0 = extraout_RDX_02;
      QTextLine::naturalTextRect();
      QRectF::operator|=((QRectF *)CONCAT44(uVar2,in_stack_fffffffffffffdf8),
                         in_stack_fffffffffffffdf0);
    }
    (**(code **)(*in_RSI + 0x80))(local_128,in_RSI,local_18);
    local_108 = QRectF::topLeft((QRectF *)CONCAT44(uVar2,in_stack_fffffffffffffdf8));
    QRectF::translate(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  else {
LAB_0071217d:
    QTextCursor::selectionEnd();
    QWidgetTextControlPrivate::rectForPosition(in_stack_fffffffffffffe78,iVar4);
    QRectF::operator|=((QRectF *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                       in_stack_fffffffffffffdf0);
    boundingRectOfFloatsInSelection(in_stack_fffffffffffffe40);
    QRectF::operator|=((QRectF *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                       in_stack_fffffffffffffdf0);
    plVar8 = (long *)QTextDocument::documentLayout();
    uVar9 = QTextCursor::currentFrame();
    (**(code **)(*plVar8 + 0x80))(&stack0xfffffffffffffe78,plVar8,uVar9);
    qVar10 = QRectF::left((QRectF *)&stack0xfffffffffffffe78);
    QRectF::setLeft(in_RDI,qVar10);
    qVar10 = QRectF::right((QRectF *)&stack0xfffffffffffffe78);
    QRectF::setRight(in_RDI,qVar10);
  }
  bVar1 = QRectF::isValid(in_RDI);
  if (bVar1) {
    QRectF::adjust(in_RDI,-1.0,-1.0,1.0,1.0);
  }
LAB_007122f2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QWidgetTextControl::selectionRect(const QTextCursor &cursor) const
{
    Q_D(const QWidgetTextControl);

    QRectF r = d->rectForPosition(cursor.selectionStart());

    if (cursor.hasComplexSelection() && cursor.currentTable()) {
        QTextTable *table = cursor.currentTable();

        r = d->doc->documentLayout()->frameBoundingRect(table);
        /*
        int firstRow, numRows, firstColumn, numColumns;
        cursor.selectedTableCells(&firstRow, &numRows, &firstColumn, &numColumns);

        const QTextTableCell firstCell = table->cellAt(firstRow, firstColumn);
        const QTextTableCell lastCell = table->cellAt(firstRow + numRows - 1, firstColumn + numColumns - 1);

        const QAbstractTextDocumentLayout * const layout = doc->documentLayout();

        QRectF tableSelRect = layout->blockBoundingRect(firstCell.firstCursorPosition().block());

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow, col);
            const qreal y = layout->blockBoundingRect(cell.firstCursorPosition().block()).top();

            tableSelRect.setTop(qMin(tableSelRect.top(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn);
            const qreal x = layout->blockBoundingRect(cell.firstCursorPosition().block()).left();

            tableSelRect.setLeft(qMin(tableSelRect.left(), x));
        }

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow + numRows - 1, col);
            const qreal y = layout->blockBoundingRect(cell.lastCursorPosition().block()).bottom();

            tableSelRect.setBottom(qMax(tableSelRect.bottom(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn + numColumns - 1);
            const qreal x = layout->blockBoundingRect(cell.lastCursorPosition().block()).right();

            tableSelRect.setRight(qMax(tableSelRect.right(), x));
        }

        r = tableSelRect.toRect();
        */
    } else if (cursor.hasSelection()) {
        const int position = cursor.selectionStart();
        const int anchor = cursor.selectionEnd();
        const QTextBlock posBlock = d->doc->findBlock(position);
        const QTextBlock anchorBlock = d->doc->findBlock(anchor);
        if (posBlock == anchorBlock && posBlock.isValid() && posBlock.layout()->lineCount()) {
            const QTextLine posLine = posBlock.layout()->lineForTextPosition(position - posBlock.position());
            const QTextLine anchorLine = anchorBlock.layout()->lineForTextPosition(anchor - anchorBlock.position());

            const int firstLine = qMin(posLine.lineNumber(), anchorLine.lineNumber());
            const int lastLine = qMax(posLine.lineNumber(), anchorLine.lineNumber());
            const QTextLayout *layout = posBlock.layout();
            r = QRectF();
            for (int i = firstLine; i <= lastLine; ++i) {
                r |= layout->lineAt(i).rect();
                r |= layout->lineAt(i).naturalTextRect(); // might be bigger in the case of wrap not enabled
            }
            r.translate(blockBoundingRect(posBlock).topLeft());
        } else {
            QRectF anchorRect = d->rectForPosition(cursor.selectionEnd());
            r |= anchorRect;
            r |= boundingRectOfFloatsInSelection(cursor);
            QRectF frameRect(d->doc->documentLayout()->frameBoundingRect(cursor.currentFrame()));
            r.setLeft(frameRect.left());
            r.setRight(frameRect.right());
        }
        if (r.isValid())
            r.adjust(-1, -1, 1, 1);
    }

    return r;
}